

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          CappedArray<char,_14UL> *rest,ArrayPtr<const_char> *rest_1,StringTree *rest_2,
          StringTree *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,
          String *rest_9,ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,
          ArrayPtr<const_char> *rest_12,String *rest_13,ArrayPtr<const_char> *rest_14,
          CappedArray<char,_14UL> *rest_15,ArrayPtr<const_char> *rest_16,StringTree *rest_17,
          ArrayPtr<const_char> *rest_18,ArrayPtr<const_char> *rest_19,ArrayPtr<const_char> *rest_20,
          ArrayPtr<const_char> *rest_21,ArrayPtr<const_char> *rest_22,String *rest_23,
          ArrayPtr<const_char> *rest_24,ArrayPtr<const_char> *rest_25,ArrayPtr<const_char> *rest_26,
          String *rest_27,ArrayPtr<const_char> *rest_28,CappedArray<char,_14UL> *rest_29,
          ArrayPtr<const_char> *rest_30,StringTree *rest_31,ArrayPtr<const_char> *rest_32,
          ArrayPtr<const_char> *rest_33,ArrayPtr<const_char> *rest_34,ArrayPtr<const_char> *rest_35,
          ArrayPtr<const_char> *rest_36,String *rest_37,ArrayPtr<const_char> *rest_38,
          ArrayPtr<const_char> *rest_39,ArrayPtr<const_char> *rest_40,String *rest_41,
          ArrayPtr<const_char> *rest_42,CappedArray<char,_14UL> *rest_43,
          ArrayPtr<const_char> *rest_44,StringTree *rest_45,ArrayPtr<const_char> *rest_46,
          String *rest_47,ArrayPtr<const_char> *rest_48,ArrayPtr<const_char> *rest_49,
          ArrayPtr<const_char> *rest_50,ArrayPtr<const_char> *rest_51,ArrayPtr<const_char> *rest_52,
          ArrayPtr<const_char> *rest_53,ArrayPtr<const_char> *rest_54,String *rest_55,
          ArrayPtr<const_char> *rest_56,CappedArray<char,_14UL> *rest_57,
          ArrayPtr<const_char> *rest_58)

{
  char *pos_00;
  
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,first);
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,
             rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30
             ,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
             rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51
             ,rest_52,rest_53,rest_54,rest_55,rest_56,rest_57,rest_58);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}